

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O2

void __thiscall GregorianCalendar::GregorianCalendar(GregorianCalendar *this,int date)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GregorianCalendar t;
  GregorianCalendar local_48;
  
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
  iVar3 = date / 0x16e + -1;
  do {
    local_48.super_Calendar.year = iVar3 + 2;
    local_48.super_Calendar.month = 1;
    local_48.super_Calendar.day = 1;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
    iVar1 = operator_cast_to_int(&local_48);
    iVar3 = iVar3 + 1;
  } while (iVar1 <= date);
  (this->super_Calendar).year = iVar3;
  iVar1 = 0;
  do {
    iVar1 = iVar1 + 1;
    local_48.super_Calendar.day = LastMonthDay(iVar1,iVar3);
    local_48.super_Calendar.month = iVar1;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
    local_48.super_Calendar.year = iVar3;
    iVar2 = operator_cast_to_int(&local_48);
  } while (iVar2 < date);
  (this->super_Calendar).month = iVar1;
  local_48.super_Calendar.day = 1;
  local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
  local_48.super_Calendar.year = iVar3;
  iVar3 = operator_cast_to_int(&local_48);
  (this->super_Calendar).day = (date - iVar3) + 1;
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(int date) {
    year = date / (365 + 1);
    while (date >= GregorianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > GregorianCalendar(month, LastMonthDay(month, year), year))
        month++;
    GregorianCalendar t = GregorianCalendar(month, 1, year);
    day = date - t + 1;
}